

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O0

bool imageHasNarrowOutlines(QImage *im)

{
  bool bVar1;
  int iVar2;
  QRgb QVar3;
  int *piVar4;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QImage *unaff_retaddr;
  int a_1;
  int y_1;
  int x;
  int a;
  int x_1;
  int y;
  bool in;
  int thick;
  int minVThick;
  int minHThick;
  bool local_45;
  int local_38;
  int local_2c;
  bool local_15;
  int local_14;
  int local_10;
  int local_c;
  long lVar5;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QImage::isNull(in_RDI);
  if (((bVar1) || (iVar2 = QImage::width(in_RDI), iVar2 < 1)) ||
     (iVar2 = QImage::height(in_RDI), iVar2 < 1)) {
    local_15 = false;
  }
  else {
    iVar2 = QImage::width(in_RDI);
    if ((iVar2 == 1) || (iVar2 = QImage::height(in_RDI), iVar2 == 1)) {
      local_15 = true;
    }
    else {
      local_c = 999;
      local_10 = 999;
      local_14 = 0;
      bVar1 = false;
      QImage::height(in_RDI);
      for (local_2c = 0; iVar2 = QImage::width(in_RDI), local_2c < iVar2; local_2c = local_2c + 1) {
        QVar3 = QImage::pixel(unaff_retaddr,(int)((ulong)lVar5 >> 0x20),(int)lVar5);
        iVar2 = qAlpha(QVar3);
        if (iVar2 < 0x80) {
          if (bVar1) {
            bVar1 = false;
            piVar4 = qMin<int>(&local_c,&local_14);
            local_c = *piVar4;
            local_14 = 0;
          }
        }
        else {
          bVar1 = true;
          local_14 = local_14 + 1;
        }
      }
      local_14 = 0;
      bVar1 = false;
      QImage::width(in_RDI);
      for (local_38 = 0; iVar2 = QImage::height(in_RDI), local_38 < iVar2; local_38 = local_38 + 1)
      {
        QVar3 = QImage::pixel(unaff_retaddr,(int)((ulong)lVar5 >> 0x20),(int)lVar5);
        iVar2 = qAlpha(QVar3);
        if (iVar2 < 0x80) {
          if (bVar1) {
            bVar1 = false;
            piVar4 = qMin<int>(&local_10,&local_14);
            local_10 = *piVar4;
            local_14 = 0;
          }
        }
        else {
          bVar1 = true;
          local_14 = local_14 + 1;
        }
      }
      local_45 = local_c == 1 || local_10 == 1;
      local_15 = local_45;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return local_15;
  }
  __stack_chk_fail();
}

Assistant:

static bool imageHasNarrowOutlines(const QImage &im)
{
    if (im.isNull() || im.width() < 1 || im.height() < 1)
        return false;
    else if (im.width() == 1 || im.height() == 1)
        return true;

    int minHThick = 999;
    int minVThick = 999;

    int thick = 0;
    bool in = false;
    int y = (im.height() + 1) / 2;
    for (int x = 0; x < im.width(); ++x) {
        int a = qAlpha(im.pixel(x, y));
        if (a > 127) {
            in = true;
            ++thick;
        } else if (in) {
            in = false;
            minHThick = qMin(minHThick, thick);
            thick = 0;
        }
    }

    thick = 0;
    in = false;
    int x = (im.width() + 1) / 2;
    for (int y = 0; y < im.height(); ++y) {
        int a = qAlpha(im.pixel(x, y));
        if (a > 127) {
            in = true;
            ++thick;
        } else if (in) {
            in = false;
            minVThick = qMin(minVThick, thick);
            thick = 0;
        }
    }

    return minHThick == 1 || minVThick == 1;
}